

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
NominalTest_TestSubTypes_Test::NominalTest_TestSubTypes_Test(NominalTest_TestSubTypes_Test *this)

{
  NominalTest_TestSubTypes_Test *this_local;
  
  TypeSystemTest<(wasm::TypeSystem)1>::TypeSystemTest(&this->super_NominalTest);
  (this->super_NominalTest).super_Test._vptr_Test =
       (_func_int **)&PTR__NominalTest_TestSubTypes_Test_003511d0;
  return;
}

Assistant:

TEST_F(NominalTest, TestSubTypes) {
  Type anyref = Type(HeapType::any, Nullable);
  Type eqref = Type(HeapType::eq, Nullable);

  // Build type types, the second of which is a subtype.
  TypeBuilder builder(2);
  builder[0] = Struct({Field(anyref, Immutable)});
  builder[1] = Struct({Field(eqref, Immutable)});
  builder[1].subTypeOf(builder[0]);

  auto result = builder.build();
  ASSERT_TRUE(result);
  auto built = *result;

  // Build a tiny wasm module that uses the types, so that we can test the
  // SubTypes utility code.
  Module wasm;
  Builder wasmBuilder(wasm);
  wasm.addFunction(wasmBuilder.makeFunction(
    "func",
    Signature(Type::none, Type::none),
    {Type(built[0], Nullable), Type(built[1], Nullable)},
    wasmBuilder.makeNop()));
  SubTypes subTypes(wasm);
  auto subTypes0 = subTypes.getStrictSubTypes(built[0]);
  EXPECT_TRUE(subTypes0.size() == 1 && subTypes0[0] == built[1]);
  auto subTypes0Inclusive = subTypes.getAllSubTypes(built[0]);
  EXPECT_TRUE(subTypes0Inclusive.size() == 2 &&
              subTypes0Inclusive[0] == built[1] &&
              subTypes0Inclusive[1] == built[0]);
  auto subTypes1 = subTypes.getStrictSubTypes(built[1]);
  EXPECT_EQ(subTypes1.size(), 0u);
}